

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::Track::SetCodecPrivate(Track *this,uint8_t *codec_private,uint64_t length)

{
  void *pvVar1;
  ulong in_RDX;
  void *in_RSI;
  long in_RDI;
  bool local_1;
  
  if ((in_RSI == (void *)0x0) || (in_RDX == 0)) {
    local_1 = false;
  }
  else {
    if (*(void **)(in_RDI + 0x10) != (void *)0x0) {
      operator_delete__(*(void **)(in_RDI + 0x10));
    }
    pvVar1 = operator_new__(in_RDX,(nothrow_t *)&std::nothrow);
    *(void **)(in_RDI + 0x10) = pvVar1;
    if (*(long *)(in_RDI + 0x10) == 0) {
      local_1 = false;
    }
    else {
      memcpy(*(void **)(in_RDI + 0x10),in_RSI,in_RDX);
      *(ulong *)(in_RDI + 0x60) = in_RDX;
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool Track::SetCodecPrivate(const uint8_t* codec_private, uint64_t length) {
  if (!codec_private || length < 1)
    return false;

  delete[] codec_private_;

  codec_private_ =
      new (std::nothrow) uint8_t[static_cast<size_t>(length)];  // NOLINT
  if (!codec_private_)
    return false;

  memcpy(codec_private_, codec_private, static_cast<size_t>(length));
  codec_private_length_ = length;

  return true;
}